

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomMemoryMappingInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomMemoryMappingInstance *this)

{
  Random *pRVar1;
  pointer *pppMVar2;
  Move<vk::Handle<(vk::HandleType)7>_> *pMVar3;
  pointer *pppMVar4;
  uint *puVar5;
  BitVector *this_00;
  uchar uVar6;
  uchar uVar7;
  undefined4 uVar8;
  pointer ppMVar9;
  pointer ppMVar10;
  long lVar11;
  long lVar12;
  ReferenceMemory *pRVar13;
  pointer puVar14;
  pointer puVar15;
  pointer puVar16;
  TotalMemoryTracker *pTVar17;
  long *plVar18;
  VkDeviceMemory obj;
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  undefined1 auVar25 [12];
  pointer pVVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  Handle<(vk::HandleType)7> HVar29;
  VkAllocationCallbacks *pVVar30;
  VkDevice pVVar31;
  pointer ppMVar32;
  byte bVar33;
  deUint32 dVar34;
  deUint32 dVar35;
  deBool dVar36;
  VkResult VVar37;
  VkDevice pVVar38;
  DeviceInterface *pDVar39;
  undefined1 *puVar40;
  size_t sVar41;
  VkDeviceSize VVar42;
  MemoryObject_conflict *pMVar43;
  MemoryMapping *pMVar44;
  pointer ppMVar45;
  value_type pMVar46;
  TestError *this_01;
  undefined1 *puVar47;
  MemoryObject_conflict *pMVar48;
  ulong uVar49;
  ulong uVar50;
  pointer ppMVar51;
  MemoryHeap *pMVar52;
  TestStatus *pTVar53;
  size_t __n;
  pointer pSVar54;
  ulong *puVar55;
  long lVar56;
  ulong uVar57;
  pointer pMVar58;
  undefined1 *puVar59;
  ulong uVar60;
  MemoryObject_conflict *pMVar61;
  long lVar62;
  pointer count_00;
  uint uVar63;
  uint uVar64;
  pointer puVar65;
  int iVar66;
  long lVar67;
  long lVar68;
  undefined1 *puVar69;
  RandomMemoryMappingInstance *pRVar70;
  pointer pSVar71;
  pointer ppMVar72;
  deRandom *rnd;
  uint uVar73;
  size_t count;
  pointer pMVar74;
  pointer ppMVar75;
  bool bVar76;
  float fVar77;
  MemoryObject_conflict *object;
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> val;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonEmptyHeaps;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonFullHeaps;
  MemoryObject_conflict *object_1;
  undefined1 local_118 [24];
  VkAllocationCallbacks *pVStack_100;
  Move<vk::Handle<(vk::HandleType)7>_> local_f8;
  RandomMemoryMappingInstance *local_d0;
  long local_c8;
  DeviceInterface *local_c0;
  VkDevice local_b8;
  deRandom *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  local_98;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  local_78;
  TestStatus *local_58;
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  *local_50;
  ulong *local_48;
  value_type local_40;
  value_type local_38;
  
  pVVar38 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar39 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  if ((this->m_memoryLimits).totalDeviceLocalMemory == 0) {
    VVar42 = (this->m_totalMemTracker).m_usage[1];
  }
  else {
    VVar42 = 0;
  }
  lVar67 = VVar42 + (this->m_totalMemTracker).m_usage[0];
  local_d0 = this;
  local_58 = __return_storage_ptr__;
  if ((this->m_memoryMappings).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_memoryMappings).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar1 = &this->m_rng;
    fVar77 = deRandom_getFloat(&pRVar1->m_rnd);
    if (fVar77 < 0.5) {
      ppMVar45 = (this->m_memoryMappings).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar9 = (this->m_memoryMappings).
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppMVar45 == ppMVar9) {
        pMVar44 = (MemoryMapping *)0x0;
      }
      else {
        uVar73 = 1;
        pMVar44 = (MemoryMapping *)0x0;
        do {
          if (((int)(uVar73 - 1) < 1) ||
             (dVar34 = deRandom_getUint32(&pRVar1->m_rnd), dVar34 % uVar73 == 0)) {
            pMVar44 = *ppMVar45;
          }
          ppMVar45 = ppMVar45 + 1;
          uVar73 = uVar73 + 1;
        } while (ppMVar45 != ppMVar9);
      }
      dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
      dVar35 = deRandom_getUint32(&pRVar1->m_rnd);
      uVar50 = (ulong)(dVar35 % 0x65);
      if (dVar34 % 3 == 2) {
        if (uVar50 != 0) {
          uVar57 = 0;
          do {
            dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
            dVar35 = deRandom_getUint32(&pRVar1->m_rnd);
            uVar49 = CONCAT44(dVar34,dVar35) % (pMVar44->m_range).size;
            bVar24 = *(byte *)((long)pMVar44->m_ptr + uVar49);
            dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
            bVar33 = (byte)dVar34 ^ bVar24;
            *(byte *)((long)pMVar44->m_ptr + uVar49) = bVar33;
            uVar49 = uVar49 + (pMVar44->m_range).offset;
            pRVar13 = pMVar44->m_reference;
            puVar14 = (pRVar13->m_bytes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (((pRVar13->m_defined).m_data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar49 >> 5] >> ((uint)uVar49 & 0x1f) & 1) == 0) {
              bVar76 = true;
            }
            else {
              bVar76 = puVar14[uVar49] == bVar24;
            }
            puVar14[uVar49] = bVar33;
            puVar5 = (pRVar13->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar49 >> 5);
            *puVar5 = *puVar5 | 1 << ((byte)uVar49 & 0x1f);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = pRVar13->m_atomSize;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = uVar49;
            bVar24 = SUB161(auVar22 / auVar20,0) & 0x1f;
            puVar5 = (pRVar13->m_flushed).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (SUB168(auVar22 / auVar20,0) >> 5);
            *puVar5 = *puVar5 & (-2 << bVar24 | 0xfffffffeU >> 0x20 - bVar24);
            if (!bVar76) {
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,(char *)0x0,
                         "m_reference.modifyXor((size_t)(m_range.offset + pos), val, mask)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                         ,0x273);
              goto LAB_0063be50;
            }
            uVar57 = uVar57 + 1;
          } while (uVar57 < uVar50);
        }
      }
      else if (dVar34 % 3 == 1) {
        if (uVar50 != 0) {
          uVar57 = 0;
          do {
            dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
            dVar35 = deRandom_getUint32(&pRVar1->m_rnd);
            uVar49 = CONCAT44(dVar34,dVar35) % (pMVar44->m_range).size;
            dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
            *(uchar *)((long)pMVar44->m_ptr + uVar49) = (uchar)dVar34;
            pRVar13 = pMVar44->m_reference;
            uVar49 = uVar49 + (pMVar44->m_range).offset;
            (pRVar13->m_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar49] = (uchar)dVar34;
            puVar5 = (pRVar13->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar49 >> 5);
            *puVar5 = *puVar5 | 1 << ((byte)uVar49 & 0x1f);
            auVar19._8_4_ = 0;
            auVar19._0_8_ = pRVar13->m_atomSize;
            auVar25._8_4_ = 0;
            auVar25._0_8_ = uVar49;
            bVar24 = SUB121(auVar25 / auVar19,0) & 0x1f;
            puVar5 = (pRVar13->m_flushed).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (SUB128(auVar25 / auVar19,0) >> 5);
            *puVar5 = *puVar5 & (-2 << bVar24 | 0xfffffffeU >> 0x20 - bVar24);
            uVar57 = uVar57 + 1;
          } while (uVar57 < uVar50);
        }
      }
      else if (uVar50 != 0) {
        uVar57 = 0;
        do {
          dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
          dVar35 = deRandom_getUint32(&pRVar1->m_rnd);
          uVar49 = CONCAT44(dVar34,dVar35) % (pMVar44->m_range).size;
          uVar6 = *(uchar *)((long)pMVar44->m_ptr + uVar49);
          uVar49 = uVar49 + (pMVar44->m_range).offset;
          pRVar13 = pMVar44->m_reference;
          puVar14 = (pRVar13->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar60 = uVar49 >> 5;
          uVar73 = 1 << ((byte)uVar49 & 0x1f);
          if (((pRVar13->m_defined).m_data.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar60] >> ((uint)uVar49 & 0x1f) & 1) == 0) {
            puVar14[uVar49] = uVar6;
            puVar5 = (pRVar13->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar60;
            *puVar5 = *puVar5 | uVar73;
          }
          else {
            uVar7 = puVar14[uVar49];
            puVar14[uVar49] = uVar6;
            puVar5 = (pRVar13->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar60;
            *puVar5 = *puVar5 | uVar73;
            if (uVar7 != uVar6) {
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,(char *)0x0,"m_reference.read((size_t)(m_range.offset + pos), val)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                         ,0x256);
              goto LAB_0063be50;
            }
          }
          uVar57 = uVar57 + 1;
        } while (uVar57 < uVar50);
      }
      goto LAB_0063b7b5;
    }
  }
  local_c0 = pDVar39;
  local_b8 = pVVar38;
  if ((this->m_mappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_mappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0063aa8a:
    if ((this->m_nonMappedMemoryObjects).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_nonMappedMemoryObjects).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar50 = (this->m_memoryLimits).totalSystemMemory;
    }
    else {
      pRVar1 = &this->m_rng;
      fVar77 = deRandom_getFloat(&pRVar1->m_rnd);
      uVar50 = (this->m_memoryLimits).totalSystemMemory;
      if ((fVar77 < 0.5) && (this->m_memoryMappingSysMemSize + lVar67 <= uVar50)) {
        ppMVar51 = (this->m_nonMappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar10 = (this->m_nonMappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar51 == ppMVar10) {
          pMVar48 = (MemoryObject_conflict *)0x0;
        }
        else {
          uVar73 = 1;
          pMVar48 = (MemoryObject_conflict *)0x0;
          do {
            if (((int)(uVar73 - 1) < 1) ||
               (dVar34 = deRandom_getUint32(&pRVar1->m_rnd), dVar34 % uVar73 == 0)) {
              pMVar48 = *ppMVar51;
            }
            ppMVar51 = ppMVar51 + 1;
            uVar73 = uVar73 + 1;
          } while (ppMVar51 != ppMVar10);
        }
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
             (deUint64)pMVar48;
        VVar42 = randomSize(pRVar1,(VkDeviceSize)pMVar48->m_atomSize,(VkDeviceSize)pMVar48->m_size);
        pMVar43 = (MemoryObject_conflict *)
                  randomOffset(pRVar1,(VkDeviceSize)pMVar48->m_atomSize,
                               (long)pMVar48->m_size - VVar42);
        VVar37 = (*local_c0->_vptr_DeviceInterface[7])
                           (local_c0,local_b8,
                            (pMVar48->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data
                            .object.m_internal,pMVar43,VVar42,0,local_118);
        ::vk::checkResult(VVar37,"vkd.mapMemory(device, *m_memory, offset, size, 0u, &ptr)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                          ,0x2ea);
        uVar27 = local_118._0_8_;
        if ((MemoryObject_conflict *)local_118._0_8_ == (MemoryObject_conflict *)0x0) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,(char *)0x0,"ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                     ,0x2eb);
LAB_0063be50:
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pMVar44 = (MemoryMapping *)operator_new(0x20);
        (pMVar44->m_range).offset = (VkDeviceSize)pMVar43;
        (pMVar44->m_range).size = VVar42;
        pMVar44->m_ptr = (void *)uVar27;
        pMVar44->m_reference = &pMVar48->m_referenceMemory;
        pMVar48->m_mapping = pMVar44;
        ppMVar45 = (local_d0->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar45 ==
            (local_d0->m_memoryMappings).
            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ppMVar9 = (local_d0->m_memoryMappings).
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __n = (long)ppMVar45 - (long)ppMVar9;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar57 = (long)__n >> 3;
          uVar50 = 1;
          if (ppMVar45 != ppMVar9) {
            uVar50 = uVar57;
          }
          uVar49 = uVar50 + uVar57;
          if (0xffffffffffffffe < uVar49) {
            uVar49 = 0xfffffffffffffff;
          }
          if (CARRY8(uVar50,uVar57)) {
            uVar49 = 0xfffffffffffffff;
          }
          if (uVar49 == 0) {
            ppMVar45 = (pointer)0x0;
          }
          else {
            ppMVar45 = (pointer)operator_new(uVar49 * 8);
          }
          ppMVar45[uVar57] = pMVar44;
          if (0 < (long)__n) {
            memmove(ppMVar45,ppMVar9,__n);
          }
          pRVar70 = local_d0;
          if (ppMVar9 != (pointer)0x0) {
            operator_delete(ppMVar9,(long)(local_d0->m_memoryMappings).
                                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)ppMVar9);
          }
          (pRVar70->m_memoryMappings).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ._M_impl.super__Vector_impl_data._M_start = ppMVar45;
          (pRVar70->m_memoryMappings).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppMVar45 + __n + 8);
          (pRVar70->m_memoryMappings).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppMVar45 + uVar49;
        }
        else {
          *ppMVar45 = pMVar44;
          pppMVar4 = &(local_d0->m_memoryMappings).
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppMVar4 = *pppMVar4 + 1;
          pRVar70 = local_d0;
        }
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ::push_back(&pRVar70->m_mappedMemoryObjects,(value_type *)&local_f8);
        ppMVar51 = (pRVar70->m_nonMappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar10 = (pRVar70->m_nonMappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar67 = (long)ppMVar10 - (long)ppMVar51;
        if (lVar67 != 0) {
          lVar67 = lVar67 >> 3;
          lVar62 = 0;
          do {
            if (ppMVar51[lVar62] == pMVar48) {
              ppMVar51[lVar62] = ppMVar10[-1];
              pppMVar2 = &(local_d0->m_nonMappedMemoryObjects).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar2 = *pppMVar2 + -1;
              break;
            }
            lVar62 = lVar62 + 1;
          } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
        }
        (local_d0->m_totalMemTracker).m_usage[0] =
             (local_d0->m_totalMemTracker).m_usage[0] + local_d0->m_memoryMappingSysMemSize;
        goto LAB_0063b7b5;
      }
    }
    local_78.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppMVar75 = local_98.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar72 = local_98.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar50 < lVar67 + this->m_memoryObjectSysMemSize) {
      pSVar54 = (this->m_memoryHeaps).
                super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar71 = (this->m_memoryHeaps).
                super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar54 != pSVar71) {
        do {
          pMVar48 = (MemoryObject_conflict *)pSVar54->m_ptr;
          if (((pMVar48->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
               m_device != (VkDevice)0x0) ||
             (bVar76 = MemoryHeap::full((MemoryHeap *)pMVar48), bVar76)) {
            local_118._0_8_ = pMVar48;
            std::
            vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
            ::push_back(&local_98,(value_type *)local_118);
            pSVar71 = (this->m_memoryHeaps).
                      super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar54 = pSVar54 + 1;
          ppMVar72 = local_98.
                     super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppMVar75 = local_98.
                     super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (pSVar54 != pSVar71);
      }
LAB_0063b514:
      if (ppMVar75 == ppMVar72) {
        pMVar52 = (MemoryHeap *)0x0;
      }
      else {
        uVar73 = 1;
        pMVar52 = (MemoryHeap *)0x0;
        do {
          if (((int)(uVar73 - 1) < 1) ||
             (dVar34 = deRandom_getUint32(&(this->m_rng).m_rnd), dVar34 % uVar73 == 0)) {
            pMVar52 = *ppMVar75;
          }
          ppMVar75 = ppMVar75 + 1;
          uVar73 = uVar73 + 1;
        } while (ppMVar75 != ppMVar72);
      }
      ppMVar51 = (pMVar52->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar10 = (pMVar52->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppMVar51 == ppMVar10) {
        pMVar48 = (MemoryObject_conflict *)0x0;
      }
      else {
        uVar73 = 1;
        pMVar48 = (MemoryObject_conflict *)0x0;
        do {
          if (((int)(uVar73 - 1) < 1) ||
             (dVar34 = deRandom_getUint32(&(this->m_rng).m_rnd), dVar34 % uVar73 == 0)) {
            pMVar48 = *ppMVar51;
          }
          ppMVar51 = ppMVar51 + 1;
          uVar73 = uVar73 + 1;
        } while (ppMVar51 != ppMVar10);
      }
      pRVar70 = local_d0;
      if (pMVar48->m_mapping != (MemoryMapping *)0x0) {
        ppMVar45 = (local_d0->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar9 = (local_d0->m_memoryMappings).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar67 = (long)ppMVar9 - (long)ppMVar45;
        if (lVar67 != 0) {
          lVar67 = lVar67 >> 3;
          lVar62 = 0;
          do {
            if (ppMVar45[lVar62] == pMVar48->m_mapping) {
              ppMVar45[lVar62] = ppMVar9[-1];
              pppMVar4 = &(local_d0->m_memoryMappings).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar4 = *pppMVar4 + -1;
              break;
            }
            lVar62 = lVar62 + 1;
          } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
        }
        (local_d0->m_totalMemTracker).m_usage[0] =
             (local_d0->m_totalMemTracker).m_usage[0] - local_d0->m_memoryMappingSysMemSize;
      }
      ppMVar51 = (local_d0->m_mappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar10 = (local_d0->m_mappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar67 = (long)ppMVar10 - (long)ppMVar51;
      if (lVar67 != 0) {
        lVar67 = lVar67 >> 3;
        lVar62 = 0;
        do {
          if (ppMVar51[lVar62] == pMVar48) {
            ppMVar51[lVar62] = ppMVar10[-1];
            pppMVar2 = &(local_d0->m_mappedMemoryObjects).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar2 = *pppMVar2 + -1;
            break;
          }
          lVar62 = lVar62 + 1;
        } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
      }
      ppMVar51 = (local_d0->m_nonMappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar10 = (local_d0->m_nonMappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar67 = (long)ppMVar10 - (long)ppMVar51;
      if (lVar67 != 0) {
        lVar67 = lVar67 >> 3;
        lVar62 = 0;
        do {
          if (ppMVar51[lVar62] == pMVar48) {
            ppMVar51[lVar62] = ppMVar10[-1];
            pppMVar2 = &(local_d0->m_nonMappedMemoryObjects).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar2 = *pppMVar2 + -1;
            break;
          }
          lVar62 = lVar62 + 1;
        } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
      }
      ppMVar51 = (pMVar52->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar10 = (pMVar52->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar67 = (long)ppMVar10 - (long)ppMVar51;
      if (lVar67 != 0) {
        lVar67 = lVar67 >> 3;
        lVar62 = 0;
        do {
          if (ppMVar51[lVar62] == pMVar48) {
            ppMVar51[lVar62] = ppMVar10[-1];
            pppMVar2 = &(pMVar52->m_objects).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar2 = *pppMVar2 + -1;
            break;
          }
          lVar62 = lVar62 + 1;
        } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
      }
      pMVar52->m_usage = pMVar52->m_usage - pMVar48->m_memoryUsage;
      pTVar17 = pMVar52->m_totalMemTracker;
      pTVar17->m_usage[0] = pTVar17->m_usage[0] - pMVar48->m_referenceMemoryUsage;
      pTVar17->m_usage[(pMVar52->m_heap).flags & 1] =
           pTVar17->m_usage[(pMVar52->m_heap).flags & 1] - pMVar48->m_memoryUsage;
      MemoryObject::~MemoryObject((MemoryObject *)pMVar48);
      operator_delete(pMVar48,0xb0);
      pTVar17 = &pRVar70->m_totalMemTracker;
      pTVar17->m_usage[0] = pTVar17->m_usage[0] - pRVar70->m_memoryObjectSysMemSize;
    }
    else {
      VVar42 = (this->m_totalMemTracker).m_usage[0];
      pSVar54 = (this->m_memoryHeaps).
                super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->m_totalMemTracker).m_usage[0] = this->m_memoryObjectSysMemSize + VVar42;
      if (pSVar54 ==
          (this->m_memoryHeaps).
          super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (this->m_totalMemTracker).m_usage[0] = VVar42;
        goto LAB_0063b514;
      }
      local_50 = &this->m_nonMappedMemoryObjects;
      do {
        pMVar48 = (MemoryObject_conflict *)pSVar54->m_ptr;
        bVar76 = MemoryHeap::full((MemoryHeap *)pMVar48);
        if (!bVar76) {
          local_118._0_8_ = pMVar48;
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ::push_back(&local_78,(value_type *)local_118);
          pMVar48 = (MemoryObject_conflict *)pSVar54->m_ptr;
        }
        if (((pMVar48->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
             m_device != (VkDevice)0x0) ||
           (bVar76 = MemoryHeap::full((MemoryHeap *)pMVar48), bVar76)) {
          local_118._0_8_ = pMVar48;
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ::push_back(&local_98,(value_type *)local_118);
        }
        ppMVar32 = local_78.
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pMVar48 = (MemoryObject_conflict *)
                  local_78.
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar72 = local_98.
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        ppMVar75 = local_98.
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this = local_d0;
        pSVar54 = pSVar54 + 1;
      } while (pSVar54 !=
               (local_d0->m_memoryHeaps).
               super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      (local_d0->m_totalMemTracker).m_usage[0] =
           (local_d0->m_totalMemTracker).m_usage[0] - local_d0->m_memoryObjectSysMemSize;
      if ((local_78.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_78.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((local_98.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_98.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
           ._M_impl.super__Vector_impl_data._M_finish &&
          (fVar77 = deRandom_getFloat(&(local_d0->m_rng).m_rnd), 0.75 <= fVar77))))
      goto LAB_0063b514;
      (this->m_totalMemTracker).m_usage[0] =
           (this->m_totalMemTracker).m_usage[0] + this->m_memoryObjectSysMemSize;
      rnd = &(this->m_rng).m_rnd;
      uVar73 = 1;
      puVar55 = (ulong *)0x0;
      do {
        if (((int)(uVar73 - 1) < 1) || (dVar34 = deRandom_getUint32(rnd), dVar34 % uVar73 == 0)) {
          puVar55 = (ulong *)((VkMemoryHeap *)&pMVar48->m_vkd)->size;
        }
        pMVar48 = (MemoryObject_conflict *)&pMVar48->m_device;
        uVar73 = uVar73 + 1;
      } while (pMVar48 != (MemoryObject_conflict *)ppMVar32);
      local_118._0_8_ = (value_type)0x0;
      local_118._8_8_ = (value_type)0x0;
      local_118._16_8_ = (pointer)0x0;
      uVar50 = puVar55[2];
      if (puVar55[3] == uVar50) {
        local_c8 = CONCAT44(local_c8._4_4_,0xffffffff);
        VVar42 = 0;
LAB_0063baac:
        local_a8 = puVar55[6];
      }
      else {
        local_a0 = (undefined1 *)((*puVar55 >> 1) - puVar55[9]);
        local_c8 = *(long *)(puVar55[5] + 8);
        local_a8 = CONCAT44(local_a8._4_4_,(int)puVar55[1]);
        lVar67 = 8;
        uVar57 = 0;
        local_b0 = rnd;
        local_48 = puVar55;
        do {
          uVar73 = *(uint *)((uVar50 - 4) + lVar67);
          puVar59 = &DAT_00000001;
          if ((uVar73 & 4) == 0) {
            puVar59 = (undefined1 *)local_48[6];
          }
          plVar18 = (long *)local_48[5];
          puVar47 = (undefined1 *)0x1000;
          if ((local_a8 & 1) != 0) {
            puVar47 = (undefined1 *)plVar18[3];
          }
          uVar8 = *(undefined4 *)((uVar50 - 8) + lVar67);
          if (puVar47 < puVar59) {
            puVar47 = puVar59;
          }
          uVar49 = (long)puVar59 * 8;
          lVar62 = *(long *)local_48[8];
          lVar11 = ((long *)local_48[8])[1];
          lVar12 = *plVar18;
          if (local_c8 == 0) {
            puVar40 = (undefined1 *)(lVar12 - (lVar11 + lVar62));
            if ((puVar47 + (long)(puVar47 +
                                 (((((ulong)puVar47 / uVar49 + ((ulong)puVar47 >> 3)) -
                                   (ulong)((ulong)puVar47 % uVar49 == 0)) + 2) -
                                 (ulong)(((ulong)puVar47 & 7) == 0))) <= puVar40) &&
               (puVar47 <= local_a0)) {
              uVar49 = ((long)puVar40 * uVar49) / ((long)puVar59 * 0x11 + 1U);
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
                   (VkDevice)(uVar49 - uVar49 % (ulong)puVar47);
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_
                   = uVar73;
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_
                   = uVar8;
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)
                   CONCAT44(local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                            m_deviceIface._4_4_,*(undefined4 *)(uVar50 + lVar67));
              std::
              vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                           *)local_118,(value_type *)&local_f8);
            }
          }
          else {
            lVar56 = lVar62;
            lVar68 = lVar12;
            if ((local_a8 & 1) != 0) {
              lVar68 = plVar18[1];
              lVar56 = lVar11;
            }
            puVar40 = (undefined1 *)(lVar12 - (lVar11 + lVar62));
            if (((puVar47 + (((((ulong)puVar47 / uVar49 + ((ulong)puVar47 >> 3)) -
                              (ulong)((ulong)puVar47 % uVar49 == 0)) + 2) -
                            (ulong)(((ulong)puVar47 & 7) == 0)) <= puVar40) && (puVar47 <= local_a0)
                ) && (puVar69 = (undefined1 *)(lVar68 - lVar56), puVar47 <= puVar69)) {
              puVar59 = (undefined1 *)(((long)puVar40 * uVar49) / ((long)puVar59 * 9 + 1U));
              if (puVar69 < puVar59) {
                puVar59 = puVar69;
              }
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
                   (VkDevice)(puVar59 + -((ulong)puVar59 % (ulong)puVar47));
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_
                   = uVar73;
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_
                   = uVar8;
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)
                   CONCAT44(local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                            m_deviceIface._4_4_,*(undefined4 *)(uVar50 + lVar67));
              std::
              vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                           *)local_118,(value_type *)&local_f8);
            }
          }
          puVar55 = local_48;
          uVar28 = local_118._8_8_;
          uVar27 = local_118._0_8_;
          uVar57 = uVar57 + 1;
          uVar50 = local_48[2];
          lVar67 = lVar67 + 0xc;
        } while (uVar57 < (ulong)(((long)(local_48[3] - uVar50) >> 2) * -0x5555555555555555));
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_ =
             0xffffffff;
        local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        if (local_118._0_8_ == local_118._8_8_) {
          if ((value_type)local_118._0_8_ != (value_type)0x0) {
            operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
          }
          local_c8 = CONCAT44(local_c8._4_4_,0xffffffff);
          VVar42 = 0;
          rnd = local_b0;
          goto LAB_0063baac;
        }
        iVar66 = 0;
        pMVar46 = (value_type)local_118._0_8_;
        do {
          if (iVar66 < 1) {
            lVar67 = (long)iVar66;
            *(VkMemoryHeapFlags *)
             &(&local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter)[lVar67].
              m_deviceIface = *(VkMemoryHeapFlags *)&pMVar46->m_device;
            (&local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object)[lVar67 * 3].
            m_internal = ((VkMemoryHeap *)&pMVar46->m_vkd)->size;
            (&local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter)[lVar67].
            m_device = (VkDevice)
                       (((vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                          *)&pMVar46->m_memoryTypeIndex)->
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                       )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            dVar34 = deRandom_getUint32(local_b0);
            if (dVar34 % (iVar66 + 1U) == 0) {
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)
                   CONCAT44(local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                            m_deviceIface._4_4_,*(VkMemoryHeapFlags *)&pMVar46->m_device);
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
                   ((VkMemoryHeap *)&pMVar46->m_vkd)->size;
              local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
                   (VkDevice)
                   (((vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                      *)&pMVar46->m_memoryTypeIndex)->
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                   )._M_impl.super__Vector_impl_data._M_start;
            }
          }
          HVar29.m_internal =
               local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
          iVar66 = iVar66 + 1;
          pMVar46 = (value_type)&pMVar46->m_size;
        } while (pMVar46 != (value_type)uVar28);
        VVar42 = (ulong)local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                        m_device >> 1;
        local_c8 = CONCAT44(local_c8._4_4_,
                            (deUint32)
                            local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                            m_internal);
        if ((value_type)uVar27 != (value_type)0x0) {
          operator_delete((void *)uVar27,local_118._16_8_ - uVar27);
        }
        local_a8 = 1;
        rnd = local_b0;
        if ((HVar29.m_internal & 0x400000000) == 0) goto LAB_0063baac;
      }
      uVar50 = 0x1000;
      if ((puVar55[1] & 1) != 0) {
        uVar50 = *(ulong *)(puVar55[5] + 0x18);
      }
      VVar42 = randomSize((Random *)rnd,local_a8,VVar42);
      if (uVar50 < local_a8) {
        uVar50 = local_a8;
      }
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_a8;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = VVar42;
      local_a0 = SUB168(auVar23 / auVar21,0);
      pVVar38 = (VkDevice)
                (((((VVar42 >> 3) + VVar42) - (ulong)((VVar42 & 7) == 0)) + ((ulong)local_a0 >> 3) +
                 2) - (ulong)((auVar23 / auVar21 & (undefined1  [16])0x7) == (undefined1  [16])0x0))
      ;
      pMVar46 = (value_type)operator_new(0xb0);
      pDVar39 = (DeviceInterface *)
                (((VVar42 / uVar50 + 1) - (ulong)(VVar42 % uVar50 == 0)) * uVar50);
      pMVar46->m_vkd = local_c0;
      pMVar46->m_device = local_b8;
      pMVar46->m_memoryTypeIndex = (deUint32)local_c8;
      pMVar46->m_size = VVar42;
      pMVar46->m_atomSize = local_a8;
      pMVar46->m_memoryUsage = (VkDeviceSize)pDVar39;
      pMVar46->m_referenceMemoryUsage = (VkDeviceSize)pVVar38;
      pMVar3 = &pMVar46->m_memory;
      (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0
      ;
      (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      pMVar46->m_mapping = (MemoryMapping *)0x0;
      (pMVar46->m_referenceMemory).m_atomSize = local_a8;
      local_118[0] = 0xde;
      local_c0 = pDVar39;
      local_b8 = pVVar38;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&(pMVar46->m_referenceMemory).m_bytes,VVar42,local_118,(allocator_type *)&local_f8)
      ;
      local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&(pMVar46->m_referenceMemory).m_defined.m_data,
                 ((VVar42 >> 5) + 1) - (ulong)((VVar42 & 0x1f) == 0),
                 (value_type_conflict1 *)local_118,(allocator_type *)&local_f8);
      local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&(pMVar46->m_referenceMemory).m_flushed.m_data,
                 (((ulong)local_a0 >> 5) + 1) - (ulong)(((ulong)local_a0 & 0x1f) == 0),
                 (value_type_conflict1 *)local_118,(allocator_type *)&local_f8);
      local_118._16_8_ = pMVar46->m_size;
      local_118._0_4_ = 5;
      local_118._8_8_ = (pointer)0x0;
      pVStack_100 = (VkAllocationCallbacks *)CONCAT44(pVStack_100._4_4_,pMVar46->m_memoryTypeIndex);
      ::vk::allocateMemory
                (&local_f8,pMVar46->m_vkd,pMVar46->m_device,(VkMemoryAllocateInfo *)local_118,
                 (VkAllocationCallbacks *)0x0);
      pVVar31 = local_b8;
      pVVar30 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
      pVVar38 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
      pDVar39 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
      HVar29.m_internal =
           local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
      local_118._16_8_ =
           local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
      pVStack_100 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                    m_allocator;
      local_118._0_8_ =
           local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
      local_118._8_8_ =
           local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
      local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
      local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj.m_internal =
           (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal;
      if (obj.m_internal == 0) {
        (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
             pVVar38;
        (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator
             = pVVar30;
        (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
             HVar29.m_internal;
        (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
        m_deviceIface = pDVar39;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  (&(pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter
                   ,obj);
        (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
             (VkDevice)local_118._16_8_;
        (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator
             = pVStack_100;
        (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
             local_118._0_8_;
        (pMVar46->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)local_118._8_8_;
        if (local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                    (&local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                     (VkDeviceMemory)
                     local_f8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
                    );
        }
      }
      puVar55[9] = (long)&local_c0->_vptr_DeviceInterface + puVar55[9];
      plVar18 = (long *)puVar55[8];
      plVar18[(uint)puVar55[1] & 1] =
           (long)&local_c0->_vptr_DeviceInterface + plVar18[(uint)puVar55[1] & 1];
      *plVar18 = (long)(pVVar31 + *plVar18);
      local_38 = pMVar46;
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   *)(puVar55 + 10),&local_38);
      local_40 = pMVar46;
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ::push_back(local_50,&local_40);
    }
    pMVar48 = (MemoryObject_conflict *)
              local_78.
              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar26 = (pointer)local_78.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_98.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      pMVar48 = (MemoryObject_conflict *)
                local_78.
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar26 = (pointer)local_78.
                         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  else {
    pRVar1 = &this->m_rng;
    fVar77 = deRandom_getFloat(&pRVar1->m_rnd);
    ppMVar51 = (this->m_mappedMemoryObjects).
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar10 = (this->m_mappedMemoryObjects).
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (0.4 <= fVar77) {
      if ((ppMVar51 != ppMVar10) && (fVar77 = deRandom_getFloat(&pRVar1->m_rnd), fVar77 < 0.25)) {
        ppMVar51 = (this->m_mappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar10 = (this->m_mappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar51 == ppMVar10) {
          pMVar48 = (MemoryObject_conflict *)0x0;
        }
        else {
          uVar73 = 1;
          pMVar48 = (MemoryObject_conflict *)0x0;
          do {
            if (((int)(uVar73 - 1) < 1) ||
               (dVar34 = deRandom_getUint32(&pRVar1->m_rnd), dVar34 % uVar73 == 0)) {
              pMVar48 = *ppMVar51;
            }
            ppMVar51 = ppMVar51 + 1;
            uVar73 = uVar73 + 1;
          } while (ppMVar51 != ppMVar10);
        }
        ppMVar45 = (this->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar9 = (this->m_memoryMappings).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar67 = (long)ppMVar9 - (long)ppMVar45;
        if (lVar67 != 0) {
          lVar67 = lVar67 >> 3;
          lVar62 = 0;
          do {
            if (ppMVar45[lVar62] == pMVar48->m_mapping) {
              ppMVar45[lVar62] = ppMVar9[-1];
              pppMVar4 = &(this->m_memoryMappings).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar4 = *pppMVar4 + -1;
              break;
            }
            lVar62 = lVar62 + 1;
          } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
        }
        plVar18 = (long *)((VkMemoryHeap *)&pMVar48->m_vkd)->size;
        local_118._0_8_ = pMVar48;
        (**(code **)(*plVar18 + 0x40))
                  (plVar18,pMVar48->m_device,
                   (pMVar48->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                   m_internal);
        operator_delete(pMVar48->m_mapping,0x20);
        pMVar48->m_mapping = (MemoryMapping *)0x0;
        ppMVar51 = (this->m_mappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar10 = (this->m_mappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar67 = (long)ppMVar10 - (long)ppMVar51;
        if (lVar67 != 0) {
          lVar67 = lVar67 >> 3;
          lVar62 = 0;
          do {
            if (ppMVar51[lVar62] == (MemoryObject_conflict *)local_118._0_8_) {
              ppMVar51[lVar62] = ppMVar10[-1];
              pppMVar2 = &(this->m_mappedMemoryObjects).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar2 = *pppMVar2 + -1;
              break;
            }
            lVar62 = lVar62 + 1;
          } while (lVar67 + (ulong)(lVar67 == 0) != lVar62);
        }
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ::push_back(&this->m_nonMappedMemoryObjects,(value_type *)local_118);
        (this->m_totalMemTracker).m_usage[0] =
             (this->m_totalMemTracker).m_usage[0] - this->m_memoryMappingSysMemSize;
        goto LAB_0063b7b5;
      }
      goto LAB_0063aa8a;
    }
    if (ppMVar51 == ppMVar10) {
      pMVar48 = (MemoryObject_conflict *)0x0;
    }
    else {
      uVar73 = 1;
      pMVar48 = (MemoryObject_conflict *)0x0;
      do {
        if (((int)(uVar73 - 1) < 1) ||
           (dVar34 = deRandom_getUint32(&pRVar1->m_rnd), dVar34 % uVar73 == 0)) {
          pMVar48 = *ppMVar51;
        }
        ppMVar51 = ppMVar51 + 1;
        uVar73 = uVar73 + 1;
      } while (ppMVar51 != ppMVar10);
    }
    dVar36 = deRandom_getBool(&pRVar1->m_rnd);
    dVar34 = deRandom_getUint32(&pRVar1->m_rnd);
    uVar50 = (ulong)(dVar34 % 10 + 1);
    if (dVar36 == 1) {
      std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::vector
                ((vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *)
                 local_118,uVar50,(allocator_type *)&local_f8);
      randomRanges(pRVar1,(vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                           *)local_118,uVar50,
                   (VkDeviceMemory)
                   (pMVar48->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                   m_internal,(pMVar48->m_mapping->m_range).offset,
                   (pMVar48->m_mapping->m_range).size,pMVar48->m_atomSize);
      if (local_118._8_8_ == local_118._0_8_) {
        uVar50 = 0;
      }
      else {
        lVar67 = 0x20;
        uVar57 = 0;
        do {
          uVar50 = (pMVar48->m_referenceMemory).m_atomSize;
          BitVector::setRange(&(pMVar48->m_referenceMemory).m_flushed,
                              *(ulong *)(local_118._0_8_ + lVar67 + -8) / uVar50,
                              *(ulong *)((long)&((VkMemoryHeap *)local_118._0_8_)->size + lVar67) /
                              uVar50,true);
          uVar57 = uVar57 + 1;
          uVar50 = ((long)(local_118._8_8_ - local_118._0_8_) >> 3) * -0x3333333333333333;
          lVar67 = lVar67 + 0x28;
        } while (uVar57 < uVar50);
      }
      pMVar48 = (MemoryObject_conflict *)0x0;
      if (local_118._0_8_ != local_118._8_8_) {
        pMVar48 = (MemoryObject_conflict *)local_118._0_8_;
      }
      VVar37 = (*local_c0->_vptr_DeviceInterface[9])(local_c0,local_b8,uVar50,pMVar48);
      ::vk::checkResult(VVar37,
                        "vkd.flushMappedMemoryRanges(device, (deUint32)ranges.size(), ranges.empty() ? DE_NULL : &ranges[0])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                        ,0x303);
      pMVar48 = (MemoryObject_conflict *)local_118._0_8_;
      pVVar26 = (pointer)local_118._16_8_;
    }
    else {
      std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::vector
                ((vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *)
                 local_118,uVar50,(allocator_type *)&local_f8);
      randomRanges(pRVar1,(vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                           *)local_118,uVar50,
                   (VkDeviceMemory)
                   (pMVar48->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                   m_internal,(pMVar48->m_mapping->m_range).offset,
                   (pMVar48->m_mapping->m_range).size,pMVar48->m_atomSize);
      pMVar43 = (MemoryObject_conflict *)local_118._0_8_;
      pMVar61 = (MemoryObject_conflict *)local_118._8_8_;
      if (local_118._8_8_ == local_118._0_8_) {
        uVar50 = 0;
      }
      else {
        this_00 = &(pMVar48->m_referenceMemory).m_defined;
        count_00 = (pointer)(pMVar48->m_referenceMemory).m_atomSize;
        uVar57 = 0;
        do {
          pMVar58 = (pointer)(&pMVar43->m_size)[uVar57 * 5];
          pMVar74 = (pointer)(&pMVar43->m_atomSize)[uVar57 * 5];
          if (count_00 == (pointer)&DAT_00000001) {
            pMVar74 = (pointer)((long)&pMVar74->index + (long)pMVar58);
            puVar15 = (pMVar48->m_referenceMemory).m_flushed.m_data.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (((ulong)pMVar58 & 0x1f) != 0 && pMVar58 < pMVar74) {
              puVar16 = (this_00->m_data).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar73 = (uint)pMVar58 & 0x1f;
              do {
                uVar50 = (ulong)pMVar58 >> 5;
                uVar63 = 1 << ((byte)uVar73 & 0x1f);
                if ((puVar15[uVar50] >> (uVar73 & 0x1f) & 1) == 0) {
                  puVar65 = (this_00->m_data).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar64 = puVar65[uVar50];
LAB_0063b3c2:
                  puVar65[uVar50] = ~uVar63 & uVar64;
                }
                else {
                  uVar64 = puVar16[uVar50];
                  puVar65 = puVar16;
                  if ((uVar64 & uVar63) == 0) goto LAB_0063b3c2;
                  puVar16[uVar50] = uVar64 | uVar63;
                }
                pMVar58 = (pointer)((long)&pMVar58->index + 1);
              } while ((pMVar58 < pMVar74) && (uVar73 = uVar73 + 1, ((ulong)pMVar58 & 0x1f) != 0));
            }
            if (pMVar58 < (pointer)((ulong)pMVar74 & 0xffffffffffffffe0)) {
              puVar16 = (this_00->m_data).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar50 = (ulong)pMVar58 >> 3 & 0xfffffffffffffffc;
              do {
                puVar5 = (uint *)((long)puVar16 + uVar50);
                *puVar5 = *puVar5 & *(uint *)((long)puVar15 + uVar50);
                pMVar58 = (pointer)&pMVar58[2].type.heapIndex;
                uVar50 = uVar50 + 4;
              } while (pMVar58 < (pointer)((ulong)pMVar74 & 0xffffffffffffffe0));
            }
            count_00 = (pointer)&DAT_00000001;
            if (pMVar58 < pMVar74) {
              puVar16 = (this_00->m_data).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar50 = (ulong)pMVar58 >> 5;
                uVar73 = 1 << ((byte)pMVar58 & 0x1f);
                if ((puVar15[uVar50] >> ((uint)pMVar58 & 0x1f) & 1) == 0) {
                  puVar65 = (this_00->m_data).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar63 = puVar65[uVar50];
LAB_0063b460:
                  puVar65[uVar50] = ~uVar73 & uVar63;
                }
                else {
                  uVar63 = puVar16[uVar50];
                  puVar65 = puVar16;
                  if ((uVar63 & uVar73) == 0) goto LAB_0063b460;
                  puVar16[uVar50] = uVar63 | uVar73;
                }
                pMVar58 = (pointer)((long)&pMVar58->index + 1);
              } while (pMVar58 < pMVar74);
            }
          }
          else if (count_00 <= pMVar74) {
            uVar50 = 0;
            do {
              uVar49 = (ulong)pMVar58 / (ulong)count_00 + uVar50;
              if (((pMVar48->m_referenceMemory).m_flushed.m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar49 >> 5] >> ((uint)uVar49 & 0x1f) & 1) == 0)
              {
                BitVector::setRange(this_00,(size_t)((long)&pMVar58->index + uVar50 * (long)count_00
                                                    ),(size_t)count_00,false);
                count_00 = (pointer)(pMVar48->m_referenceMemory).m_atomSize;
              }
              uVar50 = uVar50 + 1;
              pMVar43 = (MemoryObject_conflict *)local_118._0_8_;
              pMVar61 = (MemoryObject_conflict *)local_118._8_8_;
            } while (uVar50 < (ulong)pMVar74 / (ulong)count_00);
          }
          uVar57 = uVar57 + 1;
          uVar50 = ((long)pMVar61 - (long)pMVar43 >> 3) * -0x3333333333333333;
        } while (uVar57 < uVar50);
      }
      pMVar48 = (MemoryObject_conflict *)0x0;
      if (pMVar43 != pMVar61) {
        pMVar48 = pMVar43;
      }
      VVar37 = (*local_c0->_vptr_DeviceInterface[10])(local_c0,local_b8,uVar50,pMVar48);
      ::vk::checkResult(VVar37,
                        "vkd.invalidateMappedMemoryRanges(device, (deUint32)ranges.size(), ranges.empty() ? DE_NULL : &ranges[0])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                        ,0x310);
      pMVar48 = (MemoryObject_conflict *)local_118._0_8_;
      pVVar26 = (pointer)local_118._16_8_;
    }
  }
  if (pMVar48 != (MemoryObject_conflict *)0x0) {
    operator_delete(pMVar48,(long)pVVar26 - (long)pMVar48);
  }
LAB_0063b7b5:
  pTVar53 = local_58;
  sVar41 = local_d0->m_opNdx + 1;
  local_d0->m_opNdx = sVar41;
  if (sVar41 == 100) {
    local_118._0_8_ = (value_type)(local_118 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Pass","");
    pTVar53 = local_58;
    local_58->m_code = QP_TEST_RESULT_PASS;
    (local_58->m_description)._M_dataplus._M_p = (pointer)&(local_58->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58->m_description,local_118._0_8_,
               (undefined1 *)((long)&((VkMemoryHeap *)local_118._8_8_)->size + local_118._0_8_));
    if ((value_type)local_118._0_8_ != (value_type)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)&((MemoryType *)local_118._16_8_)->index + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  return pTVar53;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const size_t			opCount						= 100;
		const float				memoryOpProbability			= 0.5f;		// 0.50
		const float				flushInvalidateProbability	= 0.4f;		// 0.20
		const float				mapProbability				= 0.50f;	// 0.15
		const float				unmapProbability			= 0.25f;	// 0.075

		const float				allocProbability			= 0.75f; // Versun free

		const VkDevice			device						= m_context.getDevice();
		const DeviceInterface&	vkd							= m_context.getDeviceInterface();

		const VkDeviceSize		sysMemUsage					= (m_memoryLimits.totalDeviceLocalMemory == 0)
															? m_totalMemTracker.getTotalUsage()
															: m_totalMemTracker.getUsage(MEMORY_CLASS_SYSTEM);

		if (!m_memoryMappings.empty() && m_rng.getFloat() < memoryOpProbability)
		{
			// Perform operations on mapped memory
			MemoryMapping* const	mapping	= m_rng.choose<MemoryMapping*>(m_memoryMappings.begin(), m_memoryMappings.end());

			enum Op
			{
				OP_READ = 0,
				OP_WRITE,
				OP_MODIFY,
				OP_LAST
			};

			const Op op = (Op)(m_rng.getUint32() % OP_LAST);

			switch (op)
			{
				case OP_READ:
					mapping->randomRead(m_rng);
					break;

				case OP_WRITE:
					mapping->randomWrite(m_rng);
					break;

				case OP_MODIFY:
					mapping->randomModify(m_rng);
					break;

				default:
					DE_FATAL("Invalid operation");
			}
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < flushInvalidateProbability)
		{
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			if (m_rng.getBool())
				object->randomFlush(vkd, device, m_rng);
			else
				object->randomInvalidate(vkd, device, m_rng);
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < unmapProbability)
		{
			// Unmap memory object
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			// Remove mapping
			removeFirstEqual(m_memoryMappings, object->getMapping());

			object->unmap();
			removeFirstEqual(m_mappedMemoryObjects, object);
			m_nonMappedMemoryObjects.push_back(object);

			m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else if (!m_nonMappedMemoryObjects.empty() &&
				 (m_rng.getFloat() < mapProbability) &&
				 (sysMemUsage+m_memoryMappingSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory))
		{
			// Map memory object
			MemoryObject* const		object	= m_rng.choose<MemoryObject*>(m_nonMappedMemoryObjects.begin(), m_nonMappedMemoryObjects.end());
			MemoryMapping*			mapping	= object->mapRandom(vkd, device, m_rng);

			m_memoryMappings.push_back(mapping);
			m_mappedMemoryObjects.push_back(object);
			removeFirstEqual(m_nonMappedMemoryObjects, object);

			m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else
		{
			// Sort heaps based on capacity (full or not)
			vector<MemoryHeap*>		nonFullHeaps;
			vector<MemoryHeap*>		nonEmptyHeaps;

			if (sysMemUsage+m_memoryObjectSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory)
			{
				// For the duration of sorting reserve MemoryObject space from system memory
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->full())
						nonFullHeaps.push_back(heapIter->get());

					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}

				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
			else
			{
				// Not possible to even allocate MemoryObject from system memory, look for non-empty heaps
				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}
			}

			if (!nonFullHeaps.empty() && (nonEmptyHeaps.empty() || m_rng.getFloat() < allocProbability))
			{
				// Reserve MemoryObject from sys mem first
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				// Allocate more memory objects
				MemoryHeap* const	heap	= m_rng.choose<MemoryHeap*>(nonFullHeaps.begin(), nonFullHeaps.end());
				MemoryObject* const	object	= heap->allocateRandom(vkd, device, m_rng);

				m_nonMappedMemoryObjects.push_back(object);
			}
			else
			{
				// Free memory objects
				MemoryHeap* const		heap	= m_rng.choose<MemoryHeap*>(nonEmptyHeaps.begin(), nonEmptyHeaps.end());
				MemoryObject* const		object	= heap->getRandomObject(m_rng);

				// Remove mapping
				if (object->getMapping())
				{
					removeFirstEqual(m_memoryMappings, object->getMapping());
					m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, m_memoryMappingSysMemSize);
				}

				removeFirstEqual(m_mappedMemoryObjects, object);
				removeFirstEqual(m_nonMappedMemoryObjects, object);

				heap->free(object);
				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
		}

		m_opNdx += 1;
		if (m_opNdx == opCount)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::incomplete();
	}